

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cTextureStorageMultisampleTexStorage3DMultisampleTests.cpp
# Opt level: O0

IterateResult __thiscall
glcts::RequestsToSetUpMultisampleDepthTexturesWithUnsupportedNumberOfSamplesAreRejectedTest::iterate
          (RequestsToSetUpMultisampleDepthTexturesWithUnsupportedNumberOfSamplesAreRejectedTest
           *this)

{
  bool bVar1;
  int iVar2;
  deBool dVar3;
  deUint32 dVar4;
  ContextInfo *this_00;
  RenderContext *pRVar5;
  undefined4 extraout_var;
  TestError *pTVar6;
  int local_44;
  GLsizei samples;
  int fixed_sample_locations_values_index;
  int depth_renderable_internalformat_index;
  int number_of_fixed_sample_locations_values_to_check;
  int number_of_depth_renderable_internalformats_to_check;
  GLint max_depth_texture_samples;
  GLint internalformat_specific_max_samples;
  long local_20;
  Functions *gl;
  RequestsToSetUpMultisampleDepthTexturesWithUnsupportedNumberOfSamplesAreRejectedTest *this_local;
  
  gl = (Functions *)this;
  this_00 = deqp::Context::getContextInfo((this->super_TestCase).m_context);
  bVar1 = glu::ContextInfo::isExtensionSupported
                    (this_00,"GL_OES_texture_storage_multisample_2d_array");
  this->gl_oes_texture_multisample_2d_array_supported = bVar1;
  if (this->gl_oes_texture_multisample_2d_array_supported == '\0') {
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
               QP_TEST_RESULT_NOT_SUPPORTED,"OES_texture_storage_multisample_2d_array");
  }
  else {
    pRVar5 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
    iVar2 = (*pRVar5->_vptr_RenderContext[3])();
    local_20 = CONCAT44(extraout_var,iVar2);
    initInternals(this);
    do {
      dVar3 = ::deGetFalse();
      if ((dVar3 != 0) || (this->to_id == 0)) {
        pTVar6 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (pTVar6,"Texture object has not been generated.","to_id != 0",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleTexStorage3DMultisampleTests.cpp"
                   ,0x2c3);
        __cxa_throw(pTVar6,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
      }
      dVar3 = ::deGetFalse();
    } while (dVar3 != 0);
    number_of_depth_renderable_internalformats_to_check = 0;
    number_of_fixed_sample_locations_values_to_check = 0;
    (**(code **)(local_20 + 0x868))(0x910f,&number_of_fixed_sample_locations_values_to_check);
    dVar4 = (**(code **)(local_20 + 0x800))();
    glu::checkError(dVar4,"Querying maximum sample value failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleTexStorage3DMultisampleTests.cpp"
                    ,0x2d0);
    for (samples = 0; samples < 3; samples = samples + 1) {
      (**(code **)(local_20 + 0x880))
                (0x9102,*(undefined4 *)(depth_renderable_internalformats + (long)samples * 4),0x80a9
                 ,1,&number_of_depth_renderable_internalformats_to_check);
      dVar4 = (**(code **)(local_20 + 0x800))();
      glu::checkError(dVar4,"Querying texture target-spcecific maximum sample value failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleTexStorage3DMultisampleTests.cpp"
                      ,0x2dd);
      for (local_44 = 0; local_44 < 2; local_44 = local_44 + 1) {
        iVar2 = de::max<int>(number_of_depth_renderable_internalformats_to_check,
                             number_of_fixed_sample_locations_values_to_check);
        (**(code **)(local_20 + 0x13a8))
                  (0x9102,iVar2 + 1,
                   *(undefined4 *)(depth_renderable_internalformats + (long)samples * 4),1,1,1,
                   *(undefined1 *)((long)&fixed_sample_locations_values + (long)local_44));
        do {
          dVar3 = ::deGetFalse();
          if (dVar3 != 0) {
LAB_01404f5b:
            pTVar6 = (TestError *)__cxa_allocate_exception(0x38);
            tcu::TestError::TestError
                      (pTVar6,
                       "gltexStorage3DMultisample() did not generate GL_INVALID_OPERATION error.",
                       "gl.getError() == GL_INVALID_OPERATION",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleTexStorage3DMultisampleTests.cpp"
                       ,0x2ec);
            __cxa_throw(pTVar6,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
          }
          iVar2 = (**(code **)(local_20 + 0x800))();
          if (iVar2 != 0x502) goto LAB_01404f5b;
          dVar3 = ::deGetFalse();
        } while (dVar3 != 0);
      }
    }
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
               "Pass");
  }
  return STOP;
}

Assistant:

tcu::TestNode::IterateResult RequestsToSetUpMultisampleDepthTexturesWithUnsupportedNumberOfSamplesAreRejectedTest::
	iterate()
{
	gl_oes_texture_multisample_2d_array_supported =
		m_context.getContextInfo().isExtensionSupported("GL_OES_texture_storage_multisample_2d_array");

	if (!gl_oes_texture_multisample_2d_array_supported)
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_NOT_SUPPORTED, "OES_texture_storage_multisample_2d_array");

		return STOP;
	}

	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	initInternals();

	/* Check if texture object was generated properly. */
	TCU_CHECK_MSG(to_id != 0, "Texture object has not been generated.");

	glw::GLint internalformat_specific_max_samples = 0;
	glw::GLint max_depth_texture_samples		   = 0;
	int		   number_of_depth_renderable_internalformats_to_check =
		sizeof(depth_renderable_internalformats) / sizeof(depth_renderable_internalformats[0]);
	int number_of_fixed_sample_locations_values_to_check =
		sizeof(fixed_sample_locations_values) / sizeof(fixed_sample_locations_values[0]);

	/* Retrieve maximum depth texture samples value. */
	gl.getIntegerv(GL_MAX_DEPTH_TEXTURE_SAMPLES, &max_depth_texture_samples);

	/* Expect no error was generated. */
	GLU_EXPECT_NO_ERROR(gl.getError(), "Querying maximum sample value failed.");

	/* Go through all supported depth renderable internal formats. */
	for (int depth_renderable_internalformat_index = 0;
		 depth_renderable_internalformat_index < number_of_depth_renderable_internalformats_to_check;
		 depth_renderable_internalformat_index++)
	{
		/* Retrieve maximum amount of samples available for the texture target considered */
		gl.getInternalformativ(GL_TEXTURE_2D_MULTISAMPLE_ARRAY_OES,
							   depth_renderable_internalformats[depth_renderable_internalformat_index], GL_SAMPLES, 1,
							   &internalformat_specific_max_samples);

		/* Expect no error was generated. */
		GLU_EXPECT_NO_ERROR(gl.getError(), "Querying texture target-spcecific maximum sample value failed.");

		/* Go through all possible sample locations values. */
		for (int fixed_sample_locations_values_index = 0;
			 fixed_sample_locations_values_index < number_of_fixed_sample_locations_values_to_check;
			 fixed_sample_locations_values_index++)
		{
			glw::GLsizei samples = de::max(internalformat_specific_max_samples, max_depth_texture_samples) + 1;

			gl.texStorage3DMultisample(GL_TEXTURE_2D_MULTISAMPLE_ARRAY_OES, samples,
									   depth_renderable_internalformats[depth_renderable_internalformat_index], 1, 1, 1,
									   fixed_sample_locations_values[fixed_sample_locations_values_index]);

			/* Expect GL_INVALID_OPERATION error code. */
			TCU_CHECK_MSG(gl.getError() == GL_INVALID_OPERATION,
						  "gltexStorage3DMultisample() did not generate GL_INVALID_OPERATION error.");

		} /* for each fixed sample locations value */
	}	 /* for each depth renderable internalformat */

	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");

	return STOP;
}